

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall ColorPrimariesBT2020::ColorPrimariesBT2020(ColorPrimariesBT2020 *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  ColorPrimaryTransform *in_RDI;
  ColorPrimaryTransform *inToXYZ;
  ColorPrimaries *in_stack_fffffffffffffee0;
  allocator_type *in_stack_fffffffffffffef8;
  allocator_type *__a;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff00;
  vector<float,_std::allocator<float>_> *this_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar1;
  undefined1 in_stack_ffffffffffffff0c [12];
  undefined1 local_89 [49];
  undefined1 *local_58;
  undefined8 local_50;
  
  local_89._17_8_ = 0x3d72e6a73f2d9147;
  local_89._25_8_ = 0x3ce5f95900000000;
  local_89._1_8_ = 0x3e14167b3f230fae;
  local_89._9_8_ = 0x3e86809d3e2cef24;
  local_89._33_4_ = 0x3f87ce5b;
  local_58 = local_89 + 1;
  local_50 = 9;
  inToXYZ = (ColorPrimaryTransform *)local_89;
  std::allocator<float>::allocator((allocator<float> *)0x250b13);
  __l._4_12_ = in_stack_ffffffffffffff0c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff08;
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff00,__l,in_stack_fffffffffffffef8);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  __a = (allocator_type *)0x3c812dfd3fcee8d9;
  this_00 = (vector<float,_std::allocator<float>_> *)0xbd2f30a53c9081c3;
  uVar1 = 0x3f712daa;
  std::allocator<float>::allocator((allocator<float> *)0x250b8f);
  __l_00._4_12_ = in_stack_ffffffffffffff0c;
  __l_00._M_array._0_4_ = uVar1;
  std::vector<float,_std::allocator<float>_>::vector(this_00,__l_00,__a);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&in_stack_fffffffffffffee0->toXYZ,(vector<float,_std::allocator<float>_> *)inToXYZ);
  ColorPrimaries::ColorPrimaries(in_stack_fffffffffffffee0,inToXYZ,in_RDI);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x250be5);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffee0);
  std::allocator<float>::~allocator((allocator<float> *)0x250bff);
  return;
}

Assistant:

ColorPrimariesBT2020() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.636958f, +0.144617f, +0.168881f,
            +0.262700f, +0.677998f, +0.059302f,
            +0.000000f, +0.028073f, +1.060985f
        }),
        ColorPrimaryTransform({
            +1.716651f, -0.355671f, -0.253366f,
            -0.666684f, +1.616481f, +0.015769f,
            +0.017640f, -0.042771f, +0.942103f
        })
    ) {}